

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

void tcmalloc::LLA_SkiplistDelete(AllocList *head,AllocList *e,AllocList **prev)

{
  uint uVar1;
  int iVar2;
  AllocList *pAVar3;
  int i;
  ulong uVar4;
  
  pAVar3 = LLA_SkiplistSearch(head,e,prev);
  if (pAVar3 == e) {
    uVar1 = e->levels;
    for (uVar4 = 0; (uVar1 != uVar4 && (prev[uVar4]->next[uVar4] == e)); uVar4 = uVar4 + 1) {
      prev[uVar4]->next[uVar4] = e->next[uVar4];
    }
    iVar2 = head->levels;
    while ((0 < iVar2 && (head->next[iVar2 - 1] == (AllocList *)0x0))) {
      iVar2 = iVar2 + -1;
      head->levels = iVar2;
    }
    return;
  }
  syscall(1,2,"Check failed: e == found: element not in freelist\n",0x32);
  abort();
}

Assistant:

static void LLA_SkiplistDelete(AllocList *head, AllocList *e,
                               AllocList **prev) {
  AllocList *found = LLA_SkiplistSearch(head, e, prev);
  RAW_CHECK(e == found, "element not in freelist");
  for (int i = 0; i != e->levels && prev[i]->next[i] == e; i++) {
    prev[i]->next[i] = e->next[i];
  }
  while (head->levels > 0 && head->next[head->levels - 1] == 0) {
    head->levels--;   // reduce head->levels if level unused
  }
}